

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_set_shape(adios2_variable *variable,size_t ndims,size_t *shape)

{
  long in_RDX;
  long in_RSI;
  unsigned_long *in_RDI;
  Dims shapeV;
  VariableBase *variableBase;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  allocator *__a;
  allocator *__first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  allocator local_79;
  string local_78 [32];
  string *in_stack_ffffffffffffffa8;
  adios2_variable *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [32];
  long local_20;
  long local_18;
  unsigned_long *local_10;
  adios2_error local_4;
  
  __first = &local_41;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"for adios2_variable, in call to adios2_set_shape",__first);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __a = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"for start, in call to adios2_set_shape",__a);
  adios2::helper::CheckForNullptr<unsigned_long_const>
            ((unsigned_long *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_20 + local_18 * 8);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1686dc);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            (in_stack_ffffffffffffff30,(unsigned_long *)__first,in_RDI,(allocator_type *)__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x168701);
  adios2::core::VariableBase::SetShape((vector *)local_10);
  local_4 = adios2_error_none;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return local_4;
}

Assistant:

adios2_error adios2_set_shape(adios2_variable *variable, const size_t ndims, const size_t *shape)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_shape");
        adios2::helper::CheckForNullptr(shape, "for start, in call to "
                                               "adios2_set_shape");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::Dims shapeV(shape, shape + ndims);
        variableBase->SetShape(shapeV);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_shape"));
    }
}